

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

char ** VW::get_argv_from_string(string *s,int *argc)

{
  pointer psVar1;
  char *__ptr;
  char **ppcVar2;
  char *__dest;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  substring s_00;
  vector<substring,_std::allocator<substring>_> foo;
  vector<substring,_std::allocator<substring>_> local_48;
  
  __ptr = calloc_or_throw<char>(s->_M_string_length + 3);
  __ptr[0] = 'b';
  __ptr[1] = ' ';
  strcpy(__ptr + 2,(s->_M_dataplus)._M_p);
  local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  s_00.end = __ptr + 2 + s->_M_string_length;
  s_00.begin = __ptr;
  tokenize<std::vector<substring,std::allocator<substring>>>(' ',s_00,&local_48,false);
  ppcVar2 = calloc_or_throw<char*>
                      ((long)local_48.super__Vector_base<substring,_std::allocator<substring>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.super__Vector_base<substring,_std::allocator<substring>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      **(undefined1 **)
        ((long)&(local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                 super__Vector_impl_data._M_start)->end + lVar5) = 0;
      __dest = calloc_or_throw<char>
                         ((*(long *)((long)&(local_48.
                                             super__Vector_base<substring,_std::allocator<substring>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->end + lVar5
                                    ) -
                          *(long *)((long)&(local_48.
                                            super__Vector_base<substring,_std::allocator<substring>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->begin +
                                   lVar5)) + 1);
      ppcVar2[uVar4] = __dest;
      strcpy(__dest,*(char **)((long)&(local_48.
                                       super__Vector_base<substring,_std::allocator<substring>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->begin + lVar5));
      uVar4 = uVar4 + 1;
      uVar3 = (long)local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < uVar3);
  }
  psVar1 = local_48.super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
           super__Vector_impl_data._M_start;
  *argc = (int)uVar3;
  free(__ptr);
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1);
  }
  return ppcVar2;
}

Assistant:

char** get_argv_from_string(string s, int& argc)
{
  char* c = calloc_or_throw<char>(s.length() + 3);
  c[0] = 'b';
  c[1] = ' ';
  strcpy(c + 2, s.c_str());
  substring ss = {c, c + s.length() + 2};
  std::vector<substring> foo;
  tokenize(' ', ss, foo);

  char** argv = calloc_or_throw<char*>(foo.size());
  for (size_t i = 0; i < foo.size(); i++)
  {
    *(foo[i].end) = '\0';
    argv[i] = calloc_or_throw<char>(foo[i].end - foo[i].begin + 1);
    sprintf(argv[i], "%s", foo[i].begin);
  }

  argc = (int)foo.size();
  free(c);
  return argv;
}